

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O2

void __thiscall Assimp::Vertex::SortBack(Vertex *this,aiMesh *out,uint idx)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  aiVector3D *paVar3;
  long lVar4;
  undefined8 uVar5;
  float fVar6;
  bool bVar7;
  aiVector3D *paVar8;
  uint i;
  long lVar9;
  ulong uVar10;
  
  if (idx < out->mNumVertices) {
    paVar8 = out->mVertices;
    uVar10 = (ulong)idx;
    paVar8[uVar10].z = (this->position).z;
    fVar6 = (this->position).y;
    paVar8 = paVar8 + uVar10;
    paVar8->x = (this->position).x;
    paVar8->y = fVar6;
    paVar8 = out->mNormals;
    if ((paVar8 != (aiVector3D *)0x0) && (out->mNumVertices != 0)) {
      paVar8[uVar10].z = (this->normal).z;
      fVar6 = (this->normal).y;
      paVar8[uVar10].x = (this->normal).x;
      paVar8[uVar10].y = fVar6;
    }
    bVar7 = aiMesh::HasTangentsAndBitangents(out);
    if (bVar7) {
      paVar8 = out->mTangents;
      paVar8[uVar10].z = (this->tangent).z;
      fVar6 = (this->tangent).y;
      paVar8 = paVar8 + uVar10;
      paVar8->x = (this->tangent).x;
      paVar8->y = fVar6;
      paVar8 = out->mBitangents;
      paVar8[uVar10].z = (this->bitangent).z;
      fVar6 = (this->bitangent).y;
      paVar8 = paVar8 + uVar10;
      paVar8->x = (this->bitangent).x;
      paVar8->y = fVar6;
    }
    paVar8 = this->texcoords;
    lVar9 = 0;
    while (((lVar9 != 8 && (paVar3 = out->mTextureCoords[lVar9], paVar3 != (aiVector3D *)0x0)) &&
           (out->mNumVertices != 0))) {
      paVar3[uVar10].z = paVar8->z;
      fVar6 = paVar8->y;
      paVar3[uVar10].x = paVar8->x;
      paVar3[uVar10].y = fVar6;
      lVar9 = lVar9 + 1;
      paVar8 = paVar8 + 1;
    }
    lVar9 = 0;
    while (((lVar9 != 0x40 && (lVar4 = *(long *)((long)out->mColors + lVar9), lVar4 != 0)) &&
           (out->mNumVertices != 0))) {
      puVar1 = (undefined8 *)((long)&this->colors[0].r + lVar9 * 2);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)(lVar4 + uVar10 * 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar9 = lVar9 + 8;
    }
    return;
  }
  __assert_fail("idx<out->mNumVertices",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/Vertex.h"
                ,0xb5,"void Assimp::Vertex::SortBack(aiMesh *, unsigned int) const");
}

Assistant:

void SortBack(aiMesh* out, unsigned int idx) const {
        ai_assert(idx<out->mNumVertices);
        out->mVertices[idx] = position;

        if (out->HasNormals()) {
            out->mNormals[idx] = normal;
        }

        if (out->HasTangentsAndBitangents()) {
            out->mTangents[idx] = tangent;
            out->mBitangents[idx] = bitangent;
        }

        for(unsigned int i = 0; out->HasTextureCoords(i); ++i) {
            out->mTextureCoords[i][idx] = texcoords[i];
        }

        for(unsigned int i = 0; out->HasVertexColors(i); ++i) {
            out->mColors[i][idx] = colors[i];
        }
    }